

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getNgrams
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Dictionary *this,string *word)

{
  int32_t i;
  vector<int,_std::allocator<int>_> *__x;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> submorph;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subipangram;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> subngram;
  subentry sublemma;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_98;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_78;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_58;
  subentry local_40;
  
  i = getId(this,word);
  if (i < 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40.subword._M_dataplus._M_p = (pointer)&local_40.subword.field_2;
    local_40.subword._M_string_length = 0;
    local_40.subword.field_2._M_local_buf[0] = '\0';
    local_98.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    computeNgrams(this,word,__return_storage_ptr__,&local_58,&local_40,&local_98,&local_78);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_98);
    std::__cxx11::string::~string((string *)&local_40);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_78);
    std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_58);
  }
  else {
    __x = getNgrams(this,i);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> Dictionary::getNgrams(const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getNgrams(i);
  }
  std::vector<int32_t> ngrams;
  std::vector<subentry> subngram;
  std::vector<subentry> subipangram;
  subentry sublemma;
  std::vector<subentry> submorph;
  computeNgrams(word, ngrams,subngram,sublemma,submorph,subipangram);
  return ngrams;
}